

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O2

void __thiscall MyProgress::endphase(MyProgress *this,Graph *graph,bool show)

{
  if ((Graph *)this->drawing == (Graph *)0x0 || !show) {
    return;
  }
  Gecko::Drawing::draw((Graph *)this->drawing);
  return;
}

Assistant:

void endphase(const Graph* graph, bool show) const
  {
#if VERBOSE
    if (show)
      std::cerr << " f=" << fixed << setw(12) << std::setprecision(6) << graph->cost();
    std::cerr << std::endl;
#endif
    if (drawing && show)
      drawing->draw(graph);
  }